

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcDirection::~IfcDirection(IfcDirection *this)

{
  void *pvVar1;
  
  *(undefined ***)&this[-1].field_0x40 = &PTR__IfcDirection_0090fae8;
  *(undefined ***)&(this->super_IfcGeometricRepresentationItem).field_0x28 =
       &PTR__IfcDirection_0090fb60;
  *(undefined ***)&this[-1].field_0x50 = &PTR__IfcDirection_0090fb10;
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcDirection_0090fb38;
  pvVar1 = *(void **)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcGeometricRepresentationItem).
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     .field_0x20 - (long)pvVar1);
  }
  operator_delete(&this[-1].field_0x40,0x60);
  return;
}

Assistant:

IfcDirection() : Object("IfcDirection") {}